

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void ps_parser_init(PS_Parser parser,FT_Byte *base,FT_Byte *limit,FT_Memory memory)

{
  FT_Memory memory_local;
  FT_Byte *limit_local;
  FT_Byte *base_local;
  PS_Parser parser_local;
  
  parser->error = 0;
  parser->base = base;
  parser->limit = limit;
  parser->cursor = base;
  parser->memory = memory;
  memcpy(&parser->funcs,&ps_parser_funcs,0x68);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_init( PS_Parser  parser,
                  FT_Byte*   base,
                  FT_Byte*   limit,
                  FT_Memory  memory )
  {
    parser->error  = FT_Err_Ok;
    parser->base   = base;
    parser->limit  = limit;
    parser->cursor = base;
    parser->memory = memory;
    parser->funcs  = ps_parser_funcs;
  }